

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::
write_padded<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>::double_writer>
          (basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>> *this,
          align_spec *spec,double_writer *f)

{
  byte bVar1;
  undefined8 *puVar2;
  long lVar3;
  ulong uVar4;
  size_t sVar5;
  size_t size;
  char *__s;
  char *__dest;
  ulong uVar6;
  basic_buffer<char> *c;
  ulong uVar7;
  ptrdiff_t _Num;
  size_t __n;
  char __tmp;
  
  uVar4 = (ulong)spec->width_;
  uVar6 = (f->buffer->size_ + 1) - (ulong)(f->sign == '\0');
  puVar2 = *(undefined8 **)this;
  lVar3 = puVar2[2];
  sVar5 = uVar4 - uVar6;
  if (uVar4 < uVar6 || sVar5 == 0) {
    uVar6 = uVar6 + lVar3;
    if ((ulong)puVar2[3] < uVar6) {
      (**(code **)*puVar2)(puVar2,uVar6);
    }
    puVar2[2] = uVar6;
    __dest = (char *)(lVar3 + puVar2[1]);
LAB_0013cae4:
    if (f->sign != '\0') {
      *__dest = f->sign;
      __dest = __dest + 1;
      f->n = f->n - 1;
    }
    sVar5 = f->buffer->size_;
    if (sVar5 == 0) {
      return;
    }
    memmove(__dest,f->buffer->ptr_,sVar5);
    return;
  }
  uVar7 = lVar3 + uVar4;
  if ((ulong)puVar2[3] < uVar7) {
    (**(code **)*puVar2)(puVar2,uVar7);
  }
  puVar2[2] = uVar7;
  __s = (char *)(lVar3 + puVar2[1]);
  bVar1 = (byte)spec->fill_;
  if (spec->align_ == ALIGN_CENTER) {
    uVar7 = sVar5 >> 1;
    if (1 < sVar5) {
      memset(__s,(uint)bVar1,uVar7);
      __s = __s + uVar7;
    }
    if (f->sign != '\0') {
      *__s = f->sign;
      __s = __s + 1;
      f->n = f->n - 1;
    }
    __n = f->buffer->size_;
    if (__n != 0) {
      memmove(__s,f->buffer->ptr_,__n);
    }
    if (uVar4 == uVar6) {
      return;
    }
    sVar5 = sVar5 - uVar7;
  }
  else {
    if (spec->align_ == ALIGN_RIGHT) {
      __dest = __s;
      if (uVar4 != uVar6) {
        __dest = __s + sVar5;
        memset(__s,(uint)bVar1,sVar5);
      }
      goto LAB_0013cae4;
    }
    if (f->sign != '\0') {
      *__s = f->sign;
      __s = __s + 1;
      f->n = f->n - 1;
    }
    __n = f->buffer->size_;
    if (__n != 0) {
      memmove(__s,f->buffer->ptr_,__n);
    }
    if (uVar4 == uVar6) {
      return;
    }
  }
  memset(__s + __n,(uint)bVar1,sVar5);
  return;
}

Assistant:

void write_padded(const align_spec &spec, F &&f) {
    unsigned width = spec.width(); // User-perceived width (in code points).
    size_t size = f.size(); // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points)
      return f(reserve(size));
    auto &&it = reserve(width + (size - num_code_points));
    char_type fill = static_cast<char_type>(spec.fill());
    std::size_t padding = width - num_code_points;
    if (spec.align() == ALIGN_RIGHT) {
      it = std::fill_n(it, padding, fill);
      f(it);
    } else if (spec.align() == ALIGN_CENTER) {
      std::size_t left_padding = padding / 2;
      it = std::fill_n(it, left_padding, fill);
      f(it);
      it = std::fill_n(it, padding - left_padding, fill);
    } else {
      f(it);
      it = std::fill_n(it, padding, fill);
    }
  }